

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O0

void pbrt::ErrorExit<std::__cxx11::string_const&,char&,char&>
               (char *fmt,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               char *args_1,char *args_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  char *in_RDX;
  char *message;
  FileLoc *in_stack_ffffffffffffffb0;
  char local_40 [16];
  char *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  message = local_40;
  StringPrintf<std::__cxx11::string_const&,char&,char&>
            (in_RDX,in_RCX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::__cxx11::string::c_str();
  ErrorExit(in_stack_ffffffffffffffb0,message);
}

Assistant:

[[noreturn]] inline void ErrorExit(const char *fmt, Args &&... args) {
    ErrorExit(nullptr, StringPrintf(fmt, std::forward<Args>(args)...).c_str());
}